

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block_graph.cpp
# Opt level: O2

vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
* IRT::reorderByTracies
            (vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
             *__return_storage_ptr__,
            vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
            *basicBlocks)

{
  int i;
  ulong uVar1;
  long lVar2;
  vector<int,_std::allocator<int>_> newOrder;
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  reorderedBlocks;
  allocator_type local_51;
  _Vector_base<int,_std::allocator<int>_> local_50;
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  local_38;
  
  getReorderedIndecies((vector<int,_std::allocator<int>_> *)&local_50,basicBlocks);
  std::
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ::vector(&local_38,
           (long)(basicBlocks->
                 super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(basicBlocks->
                 super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,&local_51);
  lVar2 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)((long)local_50._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_50._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar1 = uVar1 + 1) {
    std::__uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>::operator=
              ((__uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_> *)
               ((long)&((local_38.
                         super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                       super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>
                       .super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl + lVar2),
               (__uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_> *)
               ((basicBlocks->
                super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start +
               local_50._M_impl.super__Vector_impl_data._M_start[uVar1]));
    lVar2 = lVar2 + 8;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_38.
       super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_38.
       super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.
       super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ::~vector(&local_38);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<CStatementList>> reorderByTracies(
            std::vector<std::unique_ptr<CStatementList>>& basicBlocks) {

        std::vector<int> newOrder = getReorderedIndecies(basicBlocks);
        std::vector<std::unique_ptr<CStatementList>> reorderedBlocks(basicBlocks.size());
        for (int i = 0; i < newOrder.size(); ++i) {
            reorderedBlocks[i] = std::move(basicBlocks[newOrder[i]]);
        }

        return std::move(reorderedBlocks);
    }